

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

sfts_t * sfts_openro(char *name,...)

{
  char in_AL;
  sfts_t *psVar1;
  char *pcVar2;
  sfts_t *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_XMM5_Qb;
  int *in_XMM6_Qa;
  int *in_XMM6_Qb;
  fitsfile *in_XMM7_Qa;
  char *_base;
  char _msg [31];
  int num;
  int i;
  int hduok;
  int dataok;
  va_list args;
  int no_verify;
  int *s;
  sfts_t *f;
  undefined8 in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  fitsfile **in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  undefined8 *puVar3;
  undefined8 local_120;
  int iVar4;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  undefined1 local_68 [30];
  undefined1 local_4a;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff60 = in_XMM5_Qb;
    in_stack_ffffffffffffff68 = in_XMM6_Qa;
    in_stack_ffffffffffffff70 = in_XMM6_Qb;
    in_stack_ffffffffffffff78 = in_XMM7_Qa;
  }
  local_120 = in_RSI;
  psVar1 = (sfts_t *)g_malloc0(0x28);
  pcVar2 = (char *)g_strdup(in_RDI);
  psVar1->name = pcVar2;
  ffopentest(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,iVar4,
             (int *)0x1088f7);
  local_30 = &stack0x00000008;
  puVar3 = &local_120;
  local_34 = 0x30;
  local_38 = 0x10;
  if ((int)local_120 != -0x21524111) {
    local_48 = sfts_get_nhdus(in_RCX);
    for (local_44 = 1; iVar4 = (int)((ulong)in_RDX >> 0x20), local_44 <= local_48;
        local_44 = local_44 + 1) {
      sfts_goto_hdu(in_RCX,iVar4);
      ffvcks(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
      iVar4 = (int)((ulong)puVar3 >> 0x20);
      if ((psVar1 != (sfts_t *)0x0) && (psVar1->stat != 0)) {
        if (psVar1->name == (char *)0x0) {
          pcVar2 = (char *)g_strdup("memory");
        }
        else {
          pcVar2 = (char *)g_path_get_basename(psVar1->name);
        }
        ffgerr(iVar4,pcVar2);
        local_4a = 0;
        _p2sc_msg("sfts_openro",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0xee,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
                  local_68,pcVar2);
        exit(1);
      }
      if (local_3c == -1) {
        _p2sc_msg("sfts_openro",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0xf1,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,
                  "FITS: incorrect DATASUM: %s",in_RDI);
        exit(1);
      }
      if (local_40 == -1) {
        _p2sc_msg("sfts_openro",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0xf3,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,
                  "FITS: incorrect CHECKSUM: %s",in_RDI);
        exit(1);
      }
    }
    sfts_goto_hdu(in_RCX,iVar4);
  }
  return psVar1;
}

Assistant:

sfts_t *sfts_openro(const char *name, ...) {
    sfts_t *f = (sfts_t *) g_malloc0(sizeof *f);
    int *s = &f->stat, no_verify = 0;

    f->name = g_strdup(name);
    fits_open_file(&f->fts, name, READONLY, s);

    va_list args;

    va_start(args, name);
    no_verify = va_arg(args, int);
    va_end(args);

    /* verify checksums */
    if (no_verify != SFTS_SUM_NOVERIFY) {
        int dataok, hduok, i, num = sfts_get_nhdus(f);
        for (i = 1; i <= num; ++i) {
            sfts_goto_hdu(f, i);
            fits_verify_chksum(f->fts, &dataok, &hduok, s);
            CHK_FTS(f);

            if (dataok == -1)
                P2SC_Msg(LVL_FATAL_FITS, "FITS: incorrect DATASUM: %s", name);
            if (hduok == -1)
                P2SC_Msg(LVL_FATAL_FITS, "FITS: incorrect CHECKSUM: %s", name);
        }
        sfts_goto_hdu(f, 1);
    }

    return f;
}